

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2LoadLabel(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint64_t Address_00;
  uint Op;
  uint uVar3;
  
  uVar3 = Insn >> 0xc & 0xf;
  if (uVar3 == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    Op = 0x9af;
    if ((uVar1 == 0x947) || (uVar1 == 0x956)) {
LAB_00153b0b:
      MCInst_setOpcode(Inst,Op);
      goto LAB_00153b13;
    }
    if (uVar1 != 0x966) {
      if (uVar1 != 0x95e) goto LAB_00153b13;
      Op = 0x9b3;
      goto LAB_00153b0b;
    }
LAB_00153b76:
    DVar2 = MCDisassembler_Fail;
  }
  else {
LAB_00153b13:
    uVar1 = MCInst_getOpcode(Inst);
    DVar2 = MCDisassembler_Success;
    if ((uVar1 != 0x9af) && (uVar1 != 0x9b3)) {
      DVar2 = DecodeGPRRegisterClass(Inst,uVar3,Address_00,Decoder);
      if ((DVar2 | 2) != MCDisassembler_Success) goto LAB_00153b76;
    }
    uVar1 = Insn & 0xfff;
    uVar3 = 0x80000000;
    if (uVar1 != 0) {
      uVar3 = -uVar1;
    }
    if ((Insn >> 0x17 & 1) != 0) {
      uVar3 = uVar1;
    }
    MCOperand_CreateImm0(Inst,(long)(int)uVar3);
  }
  return DVar2;
}

Assistant:

static DecodeStatus DecodeT2LoadLabel(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 23, 1);
	int imm = fieldFromInstruction_4(Insn, 0, 12);

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRBpci:
			case ARM_t2LDRHpci:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2LDRSBpci:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			case ARM_t2LDRSHpci:
				return MCDisassembler_Fail;
			default:
				break;
		}
	}

	switch(MCInst_getOpcode(Inst)) {
		case ARM_t2PLDpci:
		case ARM_t2PLIpci:
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!U) {
		// Special case for #-0.
		if (imm == 0)
			imm = INT32_MIN;
		else
			imm = -imm;
	}
	MCOperand_CreateImm0(Inst, imm);

	return S;
}